

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void ReadWord(char *word,FILE *fin)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int ch;
  int a;
  FILE *fin_local;
  char *word_local;
  
  local_1c = 0;
  iVar1 = local_1c;
LAB_001024b7:
  do {
    do {
      local_1c = iVar1;
      iVar1 = feof((FILE *)fin);
      if (iVar1 != 0) {
LAB_00102558:
        word[local_1c] = '\0';
        return;
      }
      iVar2 = fgetc((FILE *)fin);
      iVar1 = local_1c;
    } while (iVar2 == 0xd);
    if (((iVar2 != 0x20) && (iVar2 != 9)) && (iVar2 != 10)) {
      word[local_1c] = (char)iVar2;
      iVar1 = local_1c + 1;
      if (0x62 < local_1c + 1) {
        iVar1 = local_1c;
      }
      goto LAB_001024b7;
    }
    if (0 < local_1c) {
      if (iVar2 == 10) {
        ungetc(10,(FILE *)fin);
      }
      goto LAB_00102558;
    }
    if (iVar2 == 10) {
      strcpy(word,"</s>");
      return;
    }
  } while( true );
}

Assistant:

void ReadWord(char *word, FILE *fin) {
  int a = 0, ch;
  while (!feof(fin)) {
    ch = fgetc(fin);
    if (ch == 13) continue;
    if ((ch == ' ') || (ch == '\t') || (ch == '\n')) {
      if (a > 0) {
        if (ch == '\n') ungetc(ch, fin);
        break;
      }
      if (ch == '\n') {
        strcpy(word, (char *)"</s>");
        return;
      } else continue;
    }
    word[a] = ch;
    a++;
    if (a >= MAX_STRING - 1) a--;   // Truncate too long words
  }
  word[a] = 0;
}